

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O2

Aig_Man_t * Aig_ManPartSplitOne(Aig_Man_t *p,Vec_Ptr_t *vNodes,Vec_Int_t **pvPio2Id)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  Aig_Man_t *p_00;
  Vec_Int_t *p_01;
  Aig_Obj_t *pObj;
  uint uVar4;
  int iVar5;
  
  Aig_ManIncrementTravId(p);
  for (iVar5 = 0; iVar5 < vNodes->nSize; iVar5 = iVar5 + 1) {
    pvVar3 = Vec_PtrEntry(vNodes,iVar5);
    *(int *)((long)pvVar3 + 0x20) = p->nTravIds;
    *(undefined8 *)((long)pvVar3 + 0x28) = 0;
  }
  p_00 = Aig_ManStart(vNodes->nSize);
  p_01 = Vec_IntAlloc(100);
  for (iVar5 = 0; iVar1 = vNodes->nSize, iVar5 < iVar1; iVar5 = iVar5 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(vNodes,iVar5);
    Aig_ManPartSplitOne_rec(p_00,p,pObj,p_01);
  }
  iVar5 = 0;
  do {
    if (iVar1 <= iVar5) {
      if (p_00->nObjs[6] + p_00->nObjs[5] == iVar1) {
        *pvPio2Id = p_01;
        return p_00;
      }
      __assert_fail("Aig_ManNodeNum(pNew) == Vec_PtrSize(vNodes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigPartSat.c"
                    ,0xcb,"Aig_Man_t *Aig_ManPartSplitOne(Aig_Man_t *, Vec_Ptr_t *, Vec_Int_t **)");
    }
    pvVar3 = Vec_PtrEntry(vNodes,iVar5);
    uVar2 = *(uint *)&(*(Aig_Obj_t **)((long)pvVar3 + 0x28))->field_0x18 >> 6;
    uVar4 = *(uint *)((long)pvVar3 + 0x18) >> 6;
    if (uVar2 != uVar4) {
      if (uVar4 <= uVar2) {
        __assert_fail("Aig_ObjRefs((Aig_Obj_t *)pObj->pData) < Aig_ObjRefs(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigPartSat.c"
                      ,199,"Aig_Man_t *Aig_ManPartSplitOne(Aig_Man_t *, Vec_Ptr_t *, Vec_Int_t **)")
        ;
      }
      Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)((long)pvVar3 + 0x28));
      Vec_IntPush(p_01,*(int *)((long)pvVar3 + 0x24));
    }
    iVar5 = iVar5 + 1;
    iVar1 = vNodes->nSize;
  } while( true );
}

Assistant:

Aig_Man_t * Aig_ManPartSplitOne( Aig_Man_t * p, Vec_Ptr_t * vNodes, Vec_Int_t ** pvPio2Id )
{
    Vec_Int_t * vPio2Id;
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // mark these nodes
    Aig_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        Aig_ObjSetTravIdCurrent( p, pObj );
        pObj->pData = NULL;
    }
    // add these nodes in a DFS order
    pNew = Aig_ManStart( Vec_PtrSize(vNodes) );
    vPio2Id = Vec_IntAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Aig_ManPartSplitOne_rec( pNew, p, pObj, vPio2Id );
    // add the POs
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjRefs((Aig_Obj_t *)pObj->pData) != Aig_ObjRefs(pObj) )
        {
            assert( Aig_ObjRefs((Aig_Obj_t *)pObj->pData) < Aig_ObjRefs(pObj) );
            Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObj->pData );
            Vec_IntPush( vPio2Id, Aig_ObjId(pObj) );
        }
    assert( Aig_ManNodeNum(pNew) == Vec_PtrSize(vNodes) );
    *pvPio2Id = vPio2Id;
    return pNew;
}